

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O2

void __thiscall
crnlib::corpus_tester::print_metric_stats
          (corpus_tester *this,vector<crnlib::image_utils::error_metrics> *stats,uint num_blocks_x,
          uint num_blocks_y)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pdVar8 = &stats->m_p->mPeakSNR;
  dVar14 = 0.0;
  dVar15 = 0.0;
  dVar13 = 1000000.0;
  dVar12 = 0.0;
  uVar4 = 0;
  uVar5 = 0;
  uVar10 = 0;
  uVar11 = 0;
  uVar6 = 0;
  uVar9 = 0;
  for (uVar7 = 0; stats->m_size != uVar7; uVar7 = uVar7 + 1) {
    uVar2 = (uVar7 & 0xffffffff) / (ulong)num_blocks_x;
    uVar3 = (uVar7 & 0xffffffff) % (ulong)num_blocks_x;
    dVar1 = *pdVar8;
    if (dVar1 < 200.0 && dVar12 < dVar1) {
      uVar5 = uVar3;
      dVar12 = dVar1;
      uVar4 = uVar2;
    }
    if (dVar1 < dVar13) {
      uVar11 = uVar3;
      uVar10 = uVar2;
    }
    if (200.0 <= dVar1) {
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    else {
      dVar14 = dVar14 + dVar1 * dVar1;
      dVar15 = dVar15 + dVar1;
      uVar9 = uVar9 + 1;
    }
    if (dVar1 <= dVar13) {
      dVar13 = dVar1;
    }
    pdVar8 = pdVar8 + 5;
  }
  console::printf("Number of infinite PSNR blocks: %u",uVar6);
  console::printf("Number of non-infinite PSNR blocks: %u",(ulong)uVar9);
  if (uVar9 != 0) {
    dVar15 = dVar15 * (1.0 / (double)uVar9);
    console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f",dVar15,
                    SQRT(dVar14 * (1.0 / (double)uVar9) - dVar15 * dVar15));
    console::printf("Worst PSNR: %3.3f, Block Location: %i,%i",dVar13,uVar11,uVar10);
    console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i",dVar12,uVar5,uVar4);
    return;
  }
  return;
}

Assistant:

void corpus_tester::print_metric_stats(const crnlib::vector<image_utils::error_metrics>& stats, uint num_blocks_x, uint num_blocks_y) {
  num_blocks_y;

  image_utils::error_metrics best_metrics;
  image_utils::error_metrics worst_metrics;
  worst_metrics.mPeakSNR = 1e+6f;

  vec2I best_loc;
  vec2I worst_loc;
  utils::zero_object(best_loc);
  utils::zero_object(worst_loc);

  double psnr_total = 0.0f;
  double psnr2_total = 0.0f;
  uint num_non_inf = 0;
  uint num_inf = 0;

  for (uint i = 0; i < stats.size(); i++) {
    uint bx = i % num_blocks_x;
    uint by = i / num_blocks_x;

    const image_utils::error_metrics& em = stats[i];

    if ((em.mPeakSNR < 200.0f) && (em > best_metrics)) {
      best_metrics = em;
      best_loc.set(bx, by);
    }
    if (em < worst_metrics) {
      worst_metrics = em;
      worst_loc.set(bx, by);
    }

    if (em.mPeakSNR < 200.0f) {
      psnr_total += em.mPeakSNR;
      psnr2_total += em.mPeakSNR * em.mPeakSNR;
      num_non_inf++;
    } else {
      num_inf++;
    }
  }

  console::printf("Number of infinite PSNR blocks: %u", num_inf);
  console::printf("Number of non-infinite PSNR blocks: %u", num_non_inf);
  if (num_non_inf) {
    psnr_total /= num_non_inf;
    psnr2_total /= num_non_inf;

    double psnr_std_dev = sqrt(psnr2_total - psnr_total * psnr_total);

    console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f", psnr_total, psnr_std_dev);
    console::printf("Worst PSNR: %3.3f, Block Location: %i,%i", worst_metrics.mPeakSNR, worst_loc[0], worst_loc[1]);
    console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i", best_metrics.mPeakSNR, best_loc[0], best_loc[1]);
  }
}